

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O3

void __thiscall Noise::addNoise(Noise *this)

{
  undefined1 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  ParameterSet *pPVar8;
  DataManager *pDVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Noise *pNVar12;
  undefined1 auVar13 [8];
  pointer pVVar14;
  value_handle vVar15;
  mesh_ptr pPVar16;
  bool bVar17;
  int iVar18;
  BaseHandle BVar19;
  long lVar20;
  undefined4 extraout_var;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar21;
  reference pvVar22;
  undefined4 extraout_var_00;
  const_reference pvVar23;
  ulong uVar24;
  int number;
  long lVar25;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  EdgeIter EVar30;
  VertexIter VVar31;
  undefined1 local_310 [8];
  TriMesh mesh;
  double noise_level;
  double impulsive_level;
  Noise *local_d0;
  undefined1 auStack_c8 [8];
  vector<double,_std::allocator<double>_> GaussianNumbers;
  int noise_type_index;
  int noise_direction_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  RandomDirections;
  undefined1 auStack_88 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  VertexListAndGaussianNumbers;
  undefined1 local_50 [8];
  VertexIter v_it;
  double local_38;
  
  DataManager::getMesh((TriMesh *)local_310,this->data_manager_);
  uVar11 = mesh.super_Mesh.
           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           .
           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
           ._168_8_;
  uVar10 = mesh.super_Mesh.
           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           .
           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
           ._160_8_;
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_310);
  if (uVar11 != uVar10) {
    pPVar8 = this->parameter_set_;
    puVar1 = &mesh.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .field_0x8;
    local_310 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Noise level","");
    bVar17 = ParameterSet::getValue
                       (pPVar8,(string *)local_310,
                        (double *)
                        &mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         .refcount_fcolors_);
    if (local_310 != (undefined1  [8])puVar1) {
      operator_delete((void *)local_310);
    }
    if (bVar17) {
      pPVar8 = this->parameter_set_;
      local_310 = (undefined1  [8])puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Impulsive level","");
      bVar17 = ParameterSet::getValue(pPVar8,(string *)local_310,&noise_level);
      if (local_310 != (undefined1  [8])puVar1) {
        operator_delete((void *)local_310);
      }
      if (bVar17) {
        pPVar8 = this->parameter_set_;
        local_310 = (undefined1  [8])puVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Noise type","");
        bVar17 = ParameterSet::getValue
                           (pPVar8,(string *)local_310,
                            (int *)&GaussianNumbers.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
        if (local_310 != (undefined1  [8])puVar1) {
          operator_delete((void *)local_310);
        }
        if (bVar17) {
          pPVar8 = this->parameter_set_;
          local_310 = (undefined1  [8])puVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"Noise direction","");
          bVar17 = ParameterSet::getValue
                             (pPVar8,(string *)local_310,
                              (int *)((long)&GaussianNumbers.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4))
          ;
          if (local_310 != (undefined1  [8])puVar1) {
            operator_delete((void *)local_310);
          }
          if (bVar17) {
            pDVar9 = this->data_manager_;
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)&pDVar9->mesh_,(PolyConnectivity *)pDVar9);
            memcpy(&(pDVar9->mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,
                   &(pDVar9->original_mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,0x84);
            local_d0 = this;
            DataManager::getMesh((TriMesh *)local_310,this->data_manager_);
            _noise_type_index =
                 OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)local_310);
            local_38 = 0.0;
            while( true ) {
              EVar30 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)local_310);
              if (RandomDirections.
                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ ==
                  (BaseHandle)EVar30.hnd_.super_BaseHandle.idx_ && _noise_type_index == EVar30.mesh_
                 ) break;
              OpenMesh::
              PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              ::calc_edge_vector((Normal *)auStack_c8,
                                 (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  *)local_310,
                                 (HalfedgeHandle)
                                 ((int)RandomDirections.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_ * 2));
              auVar13 = auStack_c8;
              impulsive_level =
                   (double)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              v_it._8_8_ = GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
              pVVar14 = RandomDirections.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              RandomDirections.
              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   (BaseHandle)(BaseHandle)((int)noise_type_index._8_4_.super_BaseHandle + 1);
              if ((ulong)pVVar14 >> 0x20 != 0) {
                OpenMesh::Iterators::
                GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                            *)&noise_type_index);
              }
              local_38 = local_38 +
                         SQRT((double)v_it._8_8_ * (double)v_it._8_8_ +
                              (double)auVar13 * (double)auVar13 + impulsive_level * impulsive_level)
              ;
            }
            lVar20 = (long)(mesh.super_Mesh.
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            ._192_8_ -
                           mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._184_8_) >> 5;
            auVar28._8_4_ =
                 (int)((long)(mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._192_8_ -
                             mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._184_8_) >> 0x25);
            auVar28._0_8_ = lVar20;
            auVar28._12_4_ = 0x45300000;
            dVar27 = (local_38 /
                     ((auVar28._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0))) *
                     (double)mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._544_8_;
            lVar20 = (long)(mesh.super_Mesh.
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            ._168_8_ -
                           mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._160_8_) >> 2;
            auVar29._8_4_ =
                 (int)((long)(mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._168_8_ -
                             mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._160_8_) >> 0x22);
            auVar29._0_8_ = lVar20;
            auVar29._12_4_ = 0x45300000;
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_face_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)local_310);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_vertex_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)local_310);
            OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::update_normals((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              *)local_310);
            pNVar12 = local_d0;
            auStack_c8 = (undefined1  [8])0x0;
            GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            RandomDirections.
            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            _noise_type_index = (EdgeIter)ZEXT816(0);
            VertexListAndGaussianNumbers.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auStack_88 = (undefined1  [8])0x0;
            VertexListAndGaussianNumbers.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            iVar18 = (int)((ulong)(mesh.super_Mesh.
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   ._168_8_ -
                                  mesh.super_Mesh.
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                  ._160_8_) >> 2);
            if ((int)GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == 0) {
              randomGaussianNumbers
                        (local_d0,0.0,dVar27,iVar18,
                         (vector<double,_std::allocator<double>_> *)auStack_c8);
              if (GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                _local_50 = OpenMesh::PolyConnectivity::vertices_begin
                                      ((PolyConnectivity *)local_310);
                while( true ) {
                  VVar31 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_310);
                  vVar15.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  if (v_it.mesh_._0_4_ == (BaseHandle)VVar31.hnd_.super_BaseHandle.idx_ &&
                      local_50 == (undefined1  [8])VVar31.mesh_) break;
                  pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar21,(int)vVar15.super_BaseHandle.idx_);
                  vVar15.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._416_4_);
                  pvVar23 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar21,(int)vVar15.super_BaseHandle.idx_);
                  vVar15.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  dVar27 = *(double *)((long)auStack_c8 + (long)(int)v_it.mesh_._0_4_ * 8);
                  dVar2 = (pvVar23->super_VectorDataT<double,_3>).values_[0];
                  dVar3 = (pvVar23->super_VectorDataT<double,_3>).values_[1];
                  dVar4 = (pvVar22->super_VectorDataT<double,_3>).values_[0];
                  dVar5 = (pvVar22->super_VectorDataT<double,_3>).values_[1];
                  v_it._8_8_ = dVar27 * (pvVar23->super_VectorDataT<double,_3>).values_[2] +
                               (pvVar22->super_VectorDataT<double,_3>).values_[2];
                  pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar21,(int)vVar15.super_BaseHandle.idx_);
                  (pvVar22->super_VectorDataT<double,_3>).values_[0] = dVar2 * dVar27 + dVar4;
                  (pvVar22->super_VectorDataT<double,_3>).values_[1] = dVar3 * dVar27 + dVar5;
                  (pvVar22->super_VectorDataT<double,_3>).values_[2] = (double)v_it._8_8_;
                  pPVar16 = v_it.mesh_;
                  v_it.mesh_._0_4_ =
                       (BaseHandle)(BaseHandle)((int)local_50._8_4_.super_BaseHandle + 1);
                  if ((ulong)pPVar16 >> 0x20 != 0) {
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_50);
                  }
                }
              }
              else {
                randomDirections(pNVar12,(int)((ulong)(mesh.super_Mesh.
                                                                                                              
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._168_8_ -
                                                  mesh.super_Mesh.
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._160_8_) >> 2),
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&noise_type_index);
                _local_50 = OpenMesh::PolyConnectivity::vertices_begin
                                      ((PolyConnectivity *)local_310);
                while( true ) {
                  VVar31 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_310);
                  vVar15.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  if (v_it.mesh_._0_4_ == (BaseHandle)VVar31.hnd_.super_BaseHandle.idx_ &&
                      local_50 == (undefined1  [8])VVar31.mesh_) break;
                  lVar20 = (long)(int)v_it.mesh_._0_4_;
                  pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar21,(int)vVar15.super_BaseHandle.idx_);
                  dVar27 = *(double *)((long)auStack_c8 + lVar20 * 8);
                  pp_Var6 = (&(_noise_type_index->super_ArrayKernel).super_BaseKernel.
                              _vptr_BaseKernel)[lVar20 * 3];
                  pp_Var7 = (&(_noise_type_index->super_ArrayKernel).super_BaseKernel.vprops_.
                              _vptr_PropertyContainer)[lVar20 * 3];
                  dVar2 = (pvVar22->super_VectorDataT<double,_3>).values_[0];
                  dVar3 = (pvVar22->super_VectorDataT<double,_3>).values_[1];
                  v_it._8_8_ = dVar27 * (double)(&(_noise_type_index->super_ArrayKernel).
                                                  super_BaseKernel.vprops_.properties_)[lVar20].
                                                super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                               (pvVar22->super_VectorDataT<double,_3>).values_[2];
                  vVar15.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
                  pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                      ((PropertyContainer *)&mesh,
                                       (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                       mesh.super_Mesh.
                                       super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       .
                                       super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                       ._412_4_);
                  pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                      (pPVar21,(int)vVar15.super_BaseHandle.idx_);
                  (pvVar22->super_VectorDataT<double,_3>).values_[0] =
                       (double)pp_Var6 * dVar27 + dVar2;
                  (pvVar22->super_VectorDataT<double,_3>).values_[1] =
                       (double)pp_Var7 * dVar27 + dVar3;
                  (pvVar22->super_VectorDataT<double,_3>).values_[2] = (double)v_it._8_8_;
                  pPVar16 = v_it.mesh_;
                  v_it.mesh_._0_4_ =
                       (BaseHandle)(BaseHandle)((int)local_50._8_4_.super_BaseHandle + 1);
                  if ((ulong)pPVar16 >> 0x20 != 0) {
                    OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_50);
                  }
                }
              }
            }
            else {
              number = (int)(((auVar29._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) *
                            noise_level);
              randomImpulsiveNumbers
                        (local_d0,0,iVar18 + -1,number,0.0,dVar27,
                         (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )auStack_88);
              if (GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
                if (0 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     (long)auStack_88) >> 4)) {
                  lVar25 = 0;
                  lVar20 = 0;
                  do {
                    uVar24 = (ulong)*(uint *)((long)(int *)auStack_88 + lVar25);
                    iVar18 = (**(_func_int **)((long)local_310 + 0x10))(local_310);
                    BVar19.idx_ = -1;
                    if (uVar24 < CONCAT44(extraout_var_00,iVar18)) {
                      BVar19.idx_ = (int)OpenMesh::ArrayKernel::handle
                                                   ((ArrayKernel *)local_310,
                                                    (Vertex *)
                                                    (uVar24 * 4 +
                                                    mesh.super_Mesh.
                                                                                                        
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._160_8_));
                    }
                    pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar21,BVar19.idx_);
                    pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._416_4_);
                    pvVar23 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar21,BVar19.idx_);
                    dVar27 = *(double *)((long)((long)auStack_88 + 8) + lVar25);
                    dVar2 = (pvVar23->super_VectorDataT<double,_3>).values_[0];
                    dVar3 = (pvVar23->super_VectorDataT<double,_3>).values_[1];
                    dVar4 = (pvVar22->super_VectorDataT<double,_3>).values_[0];
                    dVar5 = (pvVar22->super_VectorDataT<double,_3>).values_[1];
                    v_it._8_8_ = dVar27 * (pvVar23->super_VectorDataT<double,_3>).values_[2] +
                                 (pvVar22->super_VectorDataT<double,_3>).values_[2];
                    pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar21,BVar19.idx_);
                    (pvVar22->super_VectorDataT<double,_3>).values_[0] = dVar2 * dVar27 + dVar4;
                    (pvVar22->super_VectorDataT<double,_3>).values_[1] = dVar3 * dVar27 + dVar5;
                    (pvVar22->super_VectorDataT<double,_3>).values_[2] = (double)v_it._8_8_;
                    lVar20 = lVar20 + 1;
                    lVar25 = lVar25 + 0x10;
                  } while (lVar20 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                 (long)auStack_88) >> 4));
                }
              }
              else {
                randomDirections(pNVar12,number,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)&noise_type_index);
                if (0 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     (long)auStack_88) >> 4)) {
                  lVar26 = 0x10;
                  lVar25 = 0;
                  lVar20 = 0;
                  do {
                    uVar24 = (ulong)*(uint *)((long)(int *)auStack_88 + lVar25);
                    iVar18 = (**(_func_int **)((long)local_310 + 0x10))(local_310);
                    BVar19.idx_ = -1;
                    if (uVar24 < CONCAT44(extraout_var,iVar18)) {
                      BVar19.idx_ = (int)OpenMesh::ArrayKernel::handle
                                                   ((ArrayKernel *)local_310,
                                                    (Vertex *)
                                                    (uVar24 * 4 +
                                                    mesh.super_Mesh.
                                                                                                        
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._160_8_));
                    }
                    pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar21,BVar19.idx_);
                    dVar27 = *(double *)((long)((long)auStack_88 + 8) + lVar25);
                    dVar2 = *(double *)((long)_noise_type_index + lVar26 + -0x10);
                    dVar3 = *(double *)((long)_noise_type_index + lVar26 + -8);
                    dVar4 = (pvVar22->super_VectorDataT<double,_3>).values_[0];
                    dVar5 = (pvVar22->super_VectorDataT<double,_3>).values_[1];
                    v_it._8_8_ = dVar27 * *(double *)
                                           ((long)&(_noise_type_index->super_ArrayKernel).
                                                   super_BaseKernel._vptr_BaseKernel + lVar26) +
                                 (pvVar22->super_VectorDataT<double,_3>).values_[2];
                    pPVar21 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                        ((PropertyContainer *)&mesh,
                                         (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                         mesh.super_Mesh.
                                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                         .
                                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                         ._412_4_);
                    pvVar22 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                        (pPVar21,BVar19.idx_);
                    (pvVar22->super_VectorDataT<double,_3>).values_[0] = dVar2 * dVar27 + dVar4;
                    (pvVar22->super_VectorDataT<double,_3>).values_[1] = dVar3 * dVar27 + dVar5;
                    (pvVar22->super_VectorDataT<double,_3>).values_[2] = (double)v_it._8_8_;
                    lVar20 = lVar20 + 1;
                    lVar25 = lVar25 + 0x10;
                    lVar26 = lVar26 + 0x18;
                  } while (lVar20 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                                                                                                
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                 (long)auStack_88) >> 4));
                }
              }
            }
            pNVar12 = local_d0;
            pDVar9 = local_d0->data_manager_;
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)&pDVar9->mesh_,(PolyConnectivity *)local_310);
            puVar1 = &mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      .field_0x19c;
            memcpy(&(pDVar9->mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,puVar1,0x84);
            pDVar9 = pNVar12->data_manager_;
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)&pDVar9->noisy_mesh_,(PolyConnectivity *)local_310);
            memcpy(&(pDVar9->noisy_mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,puVar1,0x84);
            pDVar9 = pNVar12->data_manager_;
            OpenMesh::PolyConnectivity::operator=
                      ((PolyConnectivity *)&pDVar9->denoised_mesh_,(PolyConnectivity *)local_310);
            memcpy(&(pDVar9->denoised_mesh_).super_Mesh.
                    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    .
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    .points_,puVar1,0x84);
            if (auStack_88 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_88);
            }
            if (_noise_type_index != (mesh_ptr)0x0) {
              operator_delete(_noise_type_index);
            }
            if (auStack_c8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_c8);
            }
            OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_310);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Noise::addNoise()
{
    if(data_manager_->getMesh().n_vertices() == 0)
        return;

    // get parameters
    double noise_level, impulsive_level;
    if(!parameter_set_->getValue(string("Noise level"), noise_level))
        return;
    if(!parameter_set_->getValue(string("Impulsive level"), impulsive_level))
        return;

    int noise_type_index, noise_direction_index;
    if(!parameter_set_->getValue(string("Noise type"), noise_type_index))
        return;
    if(!parameter_set_->getValue(string("Noise direction"), noise_direction_index))
        return;

    data_manager_->MeshToOriginalMesh();

    NoiseType noise_type = (noise_type_index == 0)? kGaussian : kImpulsive;
    NoiseDirection noise_direction = (noise_direction_index == 0)? kNormal : kRandom;

    // compute average length of mesh
    double average_length = 0.0;
    TriMesh mesh = data_manager_->getMesh();
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_length += mesh.calc_edge_length(*e_it);
    double edge_numbers = (double)mesh.n_edges();
    average_length /= edge_numbers;

    // add noise
    double standard_derivation = average_length * noise_level;
    int impulsive_vertex_number = (int)(mesh.n_vertices() * impulsive_level);

    mesh.request_face_normals();
    mesh.request_vertex_normals();
    mesh.update_normals();

    std::vector<double> GaussianNumbers;
    std::vector<TriMesh::Normal> RandomDirections;
    std::vector<std::pair<int, double> > VertexListAndGaussianNumbers;

    if(noise_type == kGaussian){
        randomGaussianNumbers(0, standard_derivation, (int)mesh.n_vertices(), GaussianNumbers);
        if(noise_direction == kNormal){
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){

                TriMesh::Point p = mesh.point(*v_it) + mesh.normal(*v_it) * GaussianNumbers[v_it->idx()];
                mesh.set_point(*v_it, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections((int)mesh.n_vertices(), RandomDirections);
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){
                int index = v_it->idx();
                TriMesh::Point p = mesh.point(*v_it) + RandomDirections[index] * GaussianNumbers[index];
                mesh.set_point(*v_it, p);
            }
        }
    }
    else if(noise_type == kImpulsive){
        randomImpulsiveNumbers(0,(int)mesh.n_vertices() - 1, impulsive_vertex_number, 0, standard_derivation, VertexListAndGaussianNumbers);
        if(noise_direction == kNormal){
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + mesh.normal(vh) * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections(impulsive_vertex_number, RandomDirections);
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + RandomDirections[i] * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
    }

    data_manager_->setMesh(mesh);
    data_manager_->setNoisyMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}